

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O0

PubkeyDataStruct *
cfd::js::api::KeyStructApi::TweakAddPubkey
          (PubkeyDataStruct *__return_storage_ptr__,TweakPubkeyDataStruct *request)

{
  TweakPubkeyDataStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)> local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  TweakPubkeyDataStruct *pTStack_18;
  anon_class_1_0_00000001 call_func;
  TweakPubkeyDataStruct *request_local;
  PubkeyDataStruct *result;
  
  local_1a = 0;
  pTStack_18 = request;
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  this = pTStack_18;
  std::function<cfd::js::api::PubkeyDataStruct(cfd::js::api::TweakPubkeyDataStruct_const&)>::
  function<cfd::js::api::KeyStructApi::TweakAddPubkey(cfd::js::api::TweakPubkeyDataStruct_const&)::__0&,void>
            ((function<cfd::js::api::PubkeyDataStruct(cfd::js::api::TweakPubkeyDataStruct_const&)> *
             )local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"TweakAddPubkey",&local_129);
  ExecuteStructApi<cfd::js::api::TweakPubkeyDataStruct,cfd::js::api::PubkeyDataStruct>
            ((PubkeyDataStruct *)(local_108 + 0x20),(api *)this,(TweakPubkeyDataStruct *)local_108,
             &local_128,in_R8);
  PubkeyDataStruct::operator=(__return_storage_ptr__,(PubkeyDataStruct *)(local_108 + 0x20));
  PubkeyDataStruct::~PubkeyDataStruct((PubkeyDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>::
  ~function((function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::TweakPubkeyDataStruct_&)>
             *)local_108);
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct KeyStructApi::TweakAddPubkey(
    const TweakPubkeyDataStruct& request) {
  auto call_func =
      [](const TweakPubkeyDataStruct& request) -> PubkeyDataStruct {
    PubkeyDataStruct response;
    Pubkey pubkey(request.pubkey);
    ByteData256 tweak(request.tweak);
    response.pubkey = pubkey.CreateTweakAdd(tweak).GetHex();
    return response;
  };

  PubkeyDataStruct result;
  result = ExecuteStructApi<TweakPubkeyDataStruct, PubkeyDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}